

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gbs_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Gbs_Emu::start_track_(Gbs_Emu *this,int track)

{
  uint uVar1;
  uint8_t in_SIL;
  Gbs_Emu *in_RDI;
  int unaff_retaddr;
  uint in_stack_00000008;
  blip_time_t in_stack_0000000c;
  Gb_Apu *in_stack_00000010;
  uint load_addr;
  int i;
  blargg_err_t blargg_return_err_;
  undefined4 in_stack_ffffffffffffffb8;
  gb_addr_t in_stack_ffffffffffffffbc;
  Gb_Apu *in_stack_ffffffffffffffc0;
  Gbs_Emu *this_00;
  Classic_Emu *in_stack_ffffffffffffffc8;
  Gb_Cpu *pGVar2;
  int n;
  int local_24;
  blargg_err_t local_8;
  
  local_8 = Classic_Emu::start_track_
                      (in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  if (local_8 == (blargg_err_t)0x0) {
    memset(in_RDI->ram,0,0x4000);
    memset(in_RDI->ram + 0x4000,0xff,0x1f80);
    memset(in_RDI->ram + 0x5f80,0,0x88);
    in_RDI->ram[0x5f00] = '\0';
    Gb_Apu::reset(in_stack_ffffffffffffffc0);
    for (local_24 = 0; local_24 < 0x30; local_24 = local_24 + 1) {
      Gb_Apu::write_register(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
    }
    uVar1 = get_le16((in_RDI->header_).load_addr);
    Rom_Data<16384>::set_addr
              ((Rom_Data<16384> *)in_stack_ffffffffffffffc0,
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    (in_RDI->super_Gb_Cpu).rst_base = uVar1;
    this_00 = (Gbs_Emu *)&in_RDI->super_Gb_Cpu;
    Rom_Data<16384>::unmapped((Rom_Data<16384> *)0x7ff106);
    Gb_Cpu::reset((Gb_Cpu *)in_RDI,in_stack_ffffffffffffffc8);
    Gb_Cpu::map_code((Gb_Cpu *)in_RDI,(gb_addr_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                     (uint)in_stack_ffffffffffffffc8,this_00);
    pGVar2 = &in_RDI->super_Gb_Cpu;
    Rom_Data<16384>::at_addr((Rom_Data<16384> *)in_RDI,(blargg_long)((ulong)pGVar2 >> 0x20));
    Gb_Cpu::map_code((Gb_Cpu *)in_RDI,(gb_addr_t)((ulong)pGVar2 >> 0x20),(uint)pGVar2,this_00);
    n = (int)((ulong)pGVar2 >> 0x20);
    Rom_Data<16384>::size(&in_RDI->rom);
    set_bank(in_RDI,n);
    in_RDI->ram[0x5f06] = (in_RDI->header_).timer_modulo;
    in_RDI->ram[0x5f07] = (in_RDI->header_).timer_mode;
    update_timer(in_RDI);
    in_RDI->next_play = in_RDI->play_period;
    (in_RDI->super_Gb_Cpu).r.super_core_regs_t.a = in_SIL;
    (in_RDI->super_Gb_Cpu).r.pc = 0xf00d;
    uVar1 = get_le16((in_RDI->header_).stack_ptr);
    (in_RDI->super_Gb_Cpu).r.sp = (uint16_t)uVar1;
    in_RDI->cpu_time = 0;
    get_le16((in_RDI->header_).init_addr);
    cpu_jsr(this_00,in_stack_ffffffffffffffbc);
    local_8 = (blargg_err_t)0x0;
  }
  return local_8;
}

Assistant:

blargg_err_t Gbs_Emu::start_track_( int track )
{
	RETURN_ERR( Classic_Emu::start_track_( track ) );
	
	memset( ram, 0, 0x4000 );
	memset( ram + 0x4000, 0xFF, 0x1F80 );
	memset( ram + 0x5F80, 0, sizeof ram - 0x5F80 );
	ram [hi_page] = 0; // joypad reads back as 0
	
	apu.reset();
	for ( int i = 0; i < (int) sizeof sound_data; i++ )
		apu.write_register( 0, i + apu.start_addr, sound_data [i] );
	
	unsigned load_addr = get_le16( header_.load_addr );
	rom.set_addr( load_addr );
	cpu::rst_base = load_addr;
	
	cpu::reset( rom.unmapped() );
	
	cpu::map_code( ram_addr, 0x10000 - ram_addr, ram );
	cpu::map_code( 0, bank_size, rom.at_addr( 0 ) );
	set_bank( rom.size() > bank_size );
	
	ram [hi_page + 6] = header_.timer_modulo;
	ram [hi_page + 7] = header_.timer_mode;
	update_timer();
	next_play = play_period;
	
	cpu::r.a  = track;
	cpu::r.pc = idle_addr;
	cpu::r.sp = get_le16( header_.stack_ptr );
	cpu_time  = 0;
	cpu_jsr( get_le16( header_.init_addr ) );
	
	return 0;
}